

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::CreateTimestampFromTimeT
          (string *__return_storage_ptr__,cmTimestamp *this,time_t timeT,string *formatString,
          bool utcFlag)

{
  ulong uVar1;
  char cVar2;
  char flag;
  pointer pcVar3;
  tm *ptVar4;
  char *pcVar5;
  ulong uVar6;
  time_t local_90;
  string local_88;
  tm local_68;
  
  local_90 = timeT;
  if (formatString->_M_string_length == 0) {
    pcVar5 = "%Y-%m-%dT%H:%M:%S";
    std::__cxx11::string::assign((char *)formatString);
    this = (cmTimestamp *)pcVar5;
    if (utcFlag) {
      this = (cmTimestamp *)0x49831c;
      std::__cxx11::string::append((char *)formatString);
      goto LAB_002ae579;
    }
  }
  else if (utcFlag) {
LAB_002ae579:
    ptVar4 = gmtime(&local_90);
    goto LAB_002ae58f;
  }
  ptVar4 = localtime(&local_90);
LAB_002ae58f:
  if (ptVar4 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_68.tm_zone = ptVar4->tm_zone;
    local_68.tm_sec = ptVar4->tm_sec;
    local_68.tm_min = ptVar4->tm_min;
    local_68.tm_hour = ptVar4->tm_hour;
    local_68.tm_mday = ptVar4->tm_mday;
    local_68.tm_mon = ptVar4->tm_mon;
    local_68.tm_year = ptVar4->tm_year;
    local_68.tm_wday = ptVar4->tm_wday;
    local_68.tm_yday = ptVar4->tm_yday;
    local_68.tm_isdst = ptVar4->tm_isdst;
    local_68._36_4_ = *(undefined4 *)&ptVar4->field_0x24;
    local_68.tm_gmtoff = ptVar4->tm_gmtoff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar6 = 0;
    while (uVar6 < formatString->_M_string_length) {
      pcVar3 = (formatString->_M_dataplus)._M_p;
      cVar2 = pcVar3[uVar6];
      uVar1 = uVar6 + 1;
      if (uVar1 < formatString->_M_string_length) {
        flag = pcVar3[uVar1];
        if (flag == '\0' || cVar2 != '%') goto LAB_002ae62d;
        AddTimestampComponent_abi_cxx11_
                  (&local_88,
                   (cmTimestamp *)CONCAT71((int7)((ulong)this >> 8),flag != '\0' && cVar2 == '%'),
                   flag,&local_68);
        this = (cmTimestamp *)&local_88;
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_88);
        uVar6 = uVar6 + 2;
      }
      else {
LAB_002ae62d:
        this = (cmTimestamp *)(ulong)(uint)(int)cVar2;
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar6 = uVar1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CreateTimestampFromTimeT(time_t timeT,
    std::string formatString, bool utcFlag)
{
  if(formatString.empty())
    {
    formatString = "%Y-%m-%dT%H:%M:%S";
    if(utcFlag)
      {
      formatString += "Z";
      }
    }

  struct tm timeStruct;
  memset(&timeStruct, 0, sizeof(timeStruct));

  struct tm* ptr = (struct tm*) 0;
  if(utcFlag)
    {
    ptr = gmtime(&timeT);
    }
  else
    {
    ptr = localtime(&timeT);
    }

  if(ptr == 0)
    {
    return std::string();
    }

  timeStruct = *ptr;

  std::string result;
  for(std::string::size_type i = 0; i < formatString.size(); ++i)
    {
    char c1 = formatString[i];
    char c2 = (i+1 < formatString.size()) ?
      formatString[i+1] : static_cast<char>(0);

    if(c1 == '%' && c2 != 0)
      {
      result += AddTimestampComponent(c2, timeStruct);
      ++i;
      }
    else
      {
      result += c1;
      }
    }

  return result;
}